

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

bool __thiscall graphics101::Mesh::loadFromOBJ(Mesh *this,string *path)

{
  pointer pTVar1;
  pointer pTVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ostream *poVar9;
  istream *piVar10;
  VertexBundle *__first;
  ulong uVar11;
  long lVar12;
  long lVar13;
  allocator<(anonymous_namespace)::VertexBundle> *extraout_RDX;
  ulong __n;
  int *piVar14;
  string *this_00;
  ulong uVar15;
  long lVar16;
  long lVar17;
  string b;
  int local_4fc;
  long local_4f8;
  long local_4f0;
  real x;
  size_type local_4d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d0;
  uint local_4bc;
  real y;
  size_type local_4b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fb;
  string line;
  vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
  vb;
  string first_word;
  real z;
  istringstream linestream;
  ifstream mesh;
  uint auStack_218 [122];
  
  clear(this);
  std::ifstream::ifstream(&mesh,(string *)path,_S_in);
  local_4bc = *(uint *)((long)auStack_218 + *(long *)(_mesh + -0x18));
  if ((local_4bc & 5) == 0) {
    local_4fc = 0;
    while( true ) {
      piVar10 = std::ws<char,std::char_traits<char>>((istream *)&mesh);
      if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 2) != 0) break;
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      line._M_dataplus._M_p = (pointer)&line.field_2;
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&mesh,(string *)&line);
      if (line._M_string_length != 0) {
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)&linestream,(string *)&line,_S_in);
        first_word._M_string_length = 0;
        first_word.field_2._M_local_buf[0] = '\0';
        first_word._M_dataplus._M_p = (pointer)&first_word.field_2;
        std::operator>>((istream *)&linestream,(string *)&first_word);
        bVar4 = std::operator==(&first_word,"v");
        if (bVar4) {
          piVar10 = std::istream::_M_extract<float>((float *)&linestream);
          piVar10 = std::istream::_M_extract<float>((float *)piVar10);
          std::istream::_M_extract<float>((float *)piVar10);
          b._M_dataplus._M_p = (pointer)CONCAT44(y,(int)_x);
          b._M_string_length = CONCAT44(b._M_string_length._4_4_,z);
          std::
          vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
          ::emplace_back<glm::vec<3,float,(glm::qualifier)0>>
                    ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                      *)this,(vec<3,_float,_(glm::qualifier)0> *)&b);
        }
        else {
          bVar4 = std::operator==(&first_word,"vn");
          if (bVar4) {
            piVar10 = std::istream::_M_extract<float>((float *)&linestream);
            piVar10 = std::istream::_M_extract<float>((float *)piVar10);
            std::istream::_M_extract<float>((float *)piVar10);
            b._M_dataplus._M_p = (pointer)CONCAT44(y,(int)_x);
            b._M_string_length = CONCAT44(b._M_string_length._4_4_,z);
            std::
            vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
            ::emplace_back<glm::vec<3,float,(glm::qualifier)0>>
                      ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                        *)&this->normals,(vec<3,_float,_(glm::qualifier)0> *)&b);
          }
          else {
            bVar4 = std::operator==(&first_word,"vt");
            if (bVar4) {
              piVar10 = std::istream::_M_extract<float>((float *)&linestream);
              std::istream::_M_extract<float>((float *)piVar10);
              b._M_dataplus._M_p = (pointer)CONCAT44(y,(int)_x);
              std::
              vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
              ::emplace_back<glm::vec<2,float,(glm::qualifier)0>>
                        ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
                          *)&this->texcoords,(vec<2,_float,_(glm::qualifier)0> *)&b);
            }
            else {
              bVar4 = std::operator==(&first_word,"f");
              if (bVar4) {
                fb.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                fb.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                fb.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::reserve(&fb,4);
                while( true ) {
                  piVar10 = std::ws<char,std::char_traits<char>>((istream *)&linestream);
                  if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 2) != 0) break;
                  b._M_string_length = 0;
                  b.field_2._M_local_buf[0] = '\0';
                  b._M_dataplus._M_p = (pointer)&b.field_2;
                  std::operator>>((istream *)&linestream,(string *)&b);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&fb,&b);
                  std::__cxx11::string::~string((string *)&b);
                }
                __n = (long)fb.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)fb.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5;
                if (__n < 3) {
                  std::operator<<((ostream *)&std::cerr,
                                  "ERROR: Skipping a face with less than 3 vertices.\n");
                }
                else {
                  vb.
                  super__Vector_base<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  vb.
                  super__Vector_base<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  vb.
                  super__Vector_base<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  if (0xaaaaaaaaaaaaaaa < __n) {
                    std::__throw_length_error("vector::_M_default_append");
                  }
                  __first = (VertexBundle *)operator_new(__n * 0xc);
                  std::
                  __uninitialized_default_n_a<(anonymous_namespace)::VertexBundle*,unsigned_long,(anonymous_namespace)::VertexBundle>
                            (__first,__n,extraout_RDX);
                  vb.
                  super__Vector_base<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                  ._M_impl.super__Vector_impl_data._M_finish = __first + __n;
                  piVar14 = &__first->vn;
                  lVar13 = 0;
                  uVar11 = __n;
                  vb.
                  super__Vector_base<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                  ._M_impl.super__Vector_impl_data._M_start = __first;
                  vb.
                  super__Vector_base<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       vb.
                       super__Vector_base<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  while( true ) {
                    bVar4 = uVar11 == 0;
                    uVar11 = uVar11 - 1;
                    if (bVar4) break;
                    b._M_string_length = 0;
                    _x = (pointer)&local_4d0;
                    local_4d8 = 0;
                    uVar15 = (long)&((fb.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + lVar13;
                    b.field_2._M_local_buf[0] = '\0';
                    local_4d0._M_local_buf[0] = '\0';
                    _y = (pointer)&local_4a8;
                    local_4b0 = 0;
                    local_4a8._M_local_buf[0] = '\0';
                    b._M_dataplus._M_p = (pointer)&b.field_2;
                    lVar12 = std::__cxx11::string::find((char)uVar15,0x2f);
                    std::__cxx11::string::substr((ulong)&z,uVar15);
                    std::__cxx11::string::operator=((string *)&b,(string *)&z);
                    std::__cxx11::string::~string((string *)&z);
                    if (lVar12 != -1) {
                      lVar12 = std::__cxx11::string::find((char)uVar15,0x2f);
                      if (lVar12 == -1) {
                        std::__cxx11::string::substr((ulong)&z,uVar15);
                        this_00 = (string *)&x;
                      }
                      else {
                        std::__cxx11::string::substr((ulong)&z,uVar15);
                        std::__cxx11::string::operator=((string *)&x,(string *)&z);
                        std::__cxx11::string::~string((string *)&z);
                        std::__cxx11::string::substr((ulong)&z,uVar15);
                        this_00 = (string *)&y;
                      }
                      std::__cxx11::string::operator=(this_00,(string *)&z);
                      std::__cxx11::string::~string((string *)&z);
                    }
                    iVar6 = 0;
                    iVar5 = 0;
                    if (b._M_string_length != 0) {
                      iVar5 = std::__cxx11::stoi(&b,(size_t *)0x0,10);
                    }
                    if (local_4d8 != 0) {
                      iVar6 = std::__cxx11::stoi((string *)&x,(size_t *)0x0,10);
                    }
                    if (local_4b0 == 0) {
                      iVar7 = 0;
                    }
                    else {
                      iVar7 = std::__cxx11::stoi((string *)&y,(size_t *)0x0,10);
                    }
                    std::__cxx11::string::~string((string *)&y);
                    std::__cxx11::string::~string((string *)&x);
                    std::__cxx11::string::~string((string *)&b);
                    ((VertexBundle *)(piVar14 + -2))->v = iVar5;
                    piVar14[-1] = iVar6;
                    *piVar14 = iVar7;
                    if (iVar5 == 0) {
                      __assert_fail("vb[i].v != 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/yig[P]graphics101-meshes/src/mesh.cpp"
                                    ,0xd4,"bool graphics101::Mesh::loadFromOBJ(const std::string &)"
                                   );
                    }
                    iVar8 = -1;
                    if (iVar5 < 0) {
                      iVar8 = (int)(((long)(this->positions).
                                           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->positions).
                                          super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) / 0xc);
                    }
                    ((VertexBundle *)(piVar14 + -2))->v = iVar5 + iVar8;
                    iVar5 = (int)((ulong)((long)(this->texcoords).
                                                super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(this->texcoords).
                                               super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 3);
                    if (-1 < iVar6) {
                      iVar5 = -1;
                    }
                    piVar14[-1] = iVar5 + iVar6;
                    iVar5 = -1;
                    if (iVar7 < 0) {
                      iVar5 = (int)(((long)(this->normals).
                                           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->normals).
                                          super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) / 0xc);
                    }
                    *piVar14 = iVar7 + iVar5;
                    lVar13 = lVar13 + 0x20;
                    piVar14 = piVar14 + 3;
                  }
                  pTVar1 = (this->face_normals).
                           super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  pTVar2 = (this->face_normals).
                           super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  if ((pTVar1 != pTVar2) &&
                     ((long)pTVar1 - (long)pTVar2 !=
                      (long)(this->face_positions).
                            super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->face_positions).
                            super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
                    __assert_fail("face_normals.size() == 0 || face_normals.size() == face_positions.size()"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/yig[P]graphics101-meshes/src/mesh.cpp"
                                  ,0xdf,"bool graphics101::Mesh::loadFromOBJ(const std::string &)");
                  }
                  pTVar1 = (this->face_texcoords).
                           super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  pTVar2 = (this->face_texcoords).
                           super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  if ((pTVar1 != pTVar2) &&
                     ((long)pTVar1 - (long)pTVar2 !=
                      (long)(this->face_positions).
                            super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->face_positions).
                            super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
                    __assert_fail("face_texcoords.size() == 0 || face_texcoords.size() == face_positions.size()"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/yig[P]graphics101-meshes/src/mesh.cpp"
                                  ,0xe0,"bool graphics101::Mesh::loadFromOBJ(const std::string &)");
                  }
                  if (__n != 3) {
                    if (__n == 4) {
                      local_4fc = local_4fc + 1;
                    }
                    else {
                      poVar9 = std::operator<<((ostream *)&std::cerr,"Triangulating a face with ");
                      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                      std::operator<<(poVar9," vertices.\n");
                    }
                  }
                  lVar13 = 0xc;
                  local_4f0 = 0x14;
                  local_4f8 = 0x10;
                  lVar12 = 0x1c;
                  lVar16 = 0x20;
                  lVar17 = 0x18;
                  for (uVar11 = 2; uVar11 < __n; uVar11 = uVar11 + 1) {
                    std::vector<graphics101::Triangle,std::allocator<graphics101::Triangle>>::
                    emplace_back<int&,int&,int&>
                              ((vector<graphics101::Triangle,std::allocator<graphics101::Triangle>>
                                *)&this->face_positions,(int *)__first,
                               (int *)((long)&__first->v + lVar13),
                               (int *)((long)&__first->v + lVar17));
                    iVar5 = __first->vn;
                    if ((*(int *)((long)&__first[-1].v + lVar16) != -1) == (iVar5 == -1)) {
                      __assert_fail("( vb[0].vn == -1 ) == ( vb[i-1].vn == -1 )",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/yig[P]graphics101-meshes/src/mesh.cpp"
                                    ,0xf2,"bool graphics101::Mesh::loadFromOBJ(const std::string &)"
                                   );
                    }
                    if ((*(int *)((long)&__first->v + lVar16) != -1) == (iVar5 == -1)) {
                      __assert_fail("( vb[0].vn == -1 ) == ( vb[i].vn == -1 )",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/yig[P]graphics101-meshes/src/mesh.cpp"
                                    ,0xf3,"bool graphics101::Mesh::loadFromOBJ(const std::string &)"
                                   );
                    }
                    iVar6 = __first->vt;
                    if ((*(int *)((long)__first + lVar16 + -0x10) != -1) == (iVar6 == -1)) {
                      __assert_fail("( vb[0].vt == -1 ) == ( vb[i-1].vt == -1 )",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/yig[P]graphics101-meshes/src/mesh.cpp"
                                    ,0xf4,"bool graphics101::Mesh::loadFromOBJ(const std::string &)"
                                   );
                    }
                    if ((*(int *)((long)__first + lVar16 + -4) != -1) == (iVar6 == -1)) {
                      __assert_fail("( vb[0].vt == -1 ) == ( vb[i].vt == -1 )",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/yig[P]graphics101-meshes/src/mesh.cpp"
                                    ,0xf5,"bool graphics101::Mesh::loadFromOBJ(const std::string &)"
                                   );
                    }
                    if (iVar5 != -1) {
                      std::vector<graphics101::Triangle,std::allocator<graphics101::Triangle>>::
                      emplace_back<int&,int&,int&>
                                ((vector<graphics101::Triangle,std::allocator<graphics101::Triangle>>
                                  *)&this->face_normals,&__first->vn,
                                 (int *)((long)&__first->v + local_4f0),
                                 (int *)((long)&__first->v + lVar16));
                      iVar6 = __first->vt;
                    }
                    if (iVar6 != -1) {
                      std::vector<graphics101::Triangle,std::allocator<graphics101::Triangle>>::
                      emplace_back<int&,int&,int&>
                                ((vector<graphics101::Triangle,std::allocator<graphics101::Triangle>>
                                  *)&this->face_texcoords,&__first->vt,
                                 (int *)((long)&__first->v + local_4f8),
                                 (int *)((long)&__first->v + lVar12));
                    }
                    lVar17 = lVar17 + 0xc;
                    lVar16 = lVar16 + 0xc;
                    lVar12 = lVar12 + 0xc;
                    local_4f8 = local_4f8 + 0xc;
                    local_4f0 = local_4f0 + 0xc;
                    lVar13 = lVar13 + 0xc;
                  }
                  std::
                  vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                  ::~vector(&vb);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&fb);
              }
            }
          }
        }
        std::__cxx11::string::~string((string *)&first_word);
        std::__cxx11::istringstream::~istringstream((istringstream *)&linestream);
      }
      std::__cxx11::string::~string((string *)&line);
    }
    if (0 < local_4fc) {
      poVar9 = std::operator<<((ostream *)&std::cerr,"Triangulated ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_4fc);
      std::operator<<(poVar9," quadrilaterals.\n");
    }
  }
  else {
    poVar9 = std::operator<<((ostream *)&std::cerr,"ERROR: Unable to access path: ");
    poVar9 = std::operator<<(poVar9,(string *)path);
    std::operator<<(poVar9,'\n');
  }
  uVar3 = local_4bc & 5;
  std::ifstream::~ifstream(&mesh);
  return uVar3 == 0;
}

Assistant:

bool Mesh::loadFromOBJ( const std::string& path ) {
    using namespace std;
    
    clear();
    
    // TODO: Error checking with a printout to std::cerr and return false.
    
    // Print the number of quads triangulated only once. Keep track of the count.
    int num_quads_triangulated = 0;
    
    // Open the file.
    ifstream mesh( path );
    if( !mesh ) {
        cerr << "ERROR: Unable to access path: " << path << '\n';
        return false;
    }
    while( !( mesh >> ws ).eof() ) {
        // Get each line.
        string line;
        getline( mesh, line );
        
        // Skip blank lines.
        if( line.empty() ) continue;
        
        istringstream linestream( line );
        
        // Get the first word.
        string first_word;
        linestream >> first_word;
        
        if( first_word == "v" ) {
            real x,y,z;
            linestream >> x >> y >> z;
            positions.push_back( vec3( x,y,z ) );
        }
        else if( first_word == "vn" ) {
            real x,y,z;
            linestream >> x >> y >> z;
            normals.push_back( vec3( x,y,z ) );
        }
        else if( first_word == "vt" ) {
            real x,y;
            linestream >> x >> y;
            texcoords.push_back( vec2( x,y ) );
        }
        else if( first_word == "f" ) {
            std::vector< string > fb;
            fb.reserve( 4 );
            while( !( linestream >> ws ).eof() ) {
                string b;
                linestream >> b;
                fb.push_back( b );
            }
            if( fb.size() < 3 ) {
                cerr << "ERROR: Skipping a face with less than 3 vertices.\n";
                continue;
            }
            
            // OBJ files are 1-indexed
            // Negative indices subtract.
            
            std::vector< VertexBundle > vb;
            vb.resize( fb.size() );
            for( int i = 0; i < vb.size(); ++i ) {
                // Convert the string separated by slashes to integers.
                vb[i] = VertexBundle( fb[i] );
                
                // We must have positions, so they can't be zero.
                assert( vb[i].v != 0 );
                
                // If any index is negative, add it to that attribute's length.
                // Otherwise, subtract 1.
                if( vb[i].v  < 0 ) vb[i].v  += positions.size(); else vb[i].v  -= 1;
                if( vb[i].vt < 0 ) vb[i].vt += texcoords.size(); else vb[i].vt -= 1;
                if( vb[i].vn < 0 ) vb[i].vn += normals.size();   else vb[i].vn -= 1;
            }
            
            // We either have no normals/texcoords or we have normal/texcoord faces
            // in correspondence with position faces.
            assert( face_normals.size() == 0 || face_normals.size() == face_positions.size() );
            assert( face_texcoords.size() == 0 || face_texcoords.size() == face_positions.size() );
            
            // Add all the faces.
            if( vb.size() != 3 ) {
                if( vb.size() == 4 ) {
                    num_quads_triangulated += 1;
                } else {
                    cerr << "Triangulating a face with " << vb.size() << " vertices.\n";
                }
            }
            for( int i = 2; i < vb.size(); ++i ) {
                // Add the position face.
                face_positions.emplace_back( vb[0].v, vb[i-1].v, vb[i].v );
                
                // If one vertex bundle has normals or texcoords,
                // they all must have normals/texcoords.
                // We have already converted the OBJ coordinates back to 0-indexing,
                // so check for -1.
                assert( ( vb[0].vn == -1 ) == ( vb[i-1].vn == -1 ) );
                assert( ( vb[0].vn == -1 ) == ( vb[i].vn == -1 ) );
                assert( ( vb[0].vt == -1 ) == ( vb[i-1].vt == -1 ) );
                assert( ( vb[0].vt == -1 ) == ( vb[i].vt == -1 ) );
                
                if( vb[0].vn != -1 ) {
                    face_normals.emplace_back( vb[0].vn, vb[i-1].vn, vb[i].vn );
                }
                
                if( vb[0].vt != -1 ) {
                    face_texcoords.emplace_back( vb[0].vt, vb[i-1].vt, vb[i].vt );
                }
            }
        }
    }
    
    if( num_quads_triangulated > 0 ) {
        cerr << "Triangulated " << num_quads_triangulated << " quadrilaterals.\n";
    }
    
    return true;
}